

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  wchar_t *__first;
  wchar_t *__n;
  buffer<wchar_t> *in_RDX;
  buffer<wchar_t> *in_RSI;
  wchar_t *in_RDI;
  size_t free_cap;
  type count;
  size_t in_stack_ffffffffffffffb8;
  buffer<wchar_t> *in_stack_ffffffffffffffc0;
  buffer<wchar_t> *local_10;
  
  local_10 = in_RSI;
  do {
    __first = (wchar_t *)to_unsigned<long>((long)in_RDX - (long)local_10 >> 2);
    try_reserve(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __n = (wchar_t *)(*(long *)(in_RDI + 6) - *(long *)(in_RDI + 4));
    if (__n < __first) {
      __first = __n;
    }
    in_stack_ffffffffffffffc0 = local_10;
    make_checked<wchar_t>
              ((wchar_t *)(*(long *)(in_RDI + 2) + *(long *)(in_RDI + 4) * 4),(size_t)__first);
    std::uninitialized_copy_n<wchar_t_const*,unsigned_long,wchar_t*>
              (__first,(unsigned_long)__n,in_RDI);
    *(long *)(in_RDI + 4) = (long)__first + *(long *)(in_RDI + 4);
    local_10 = (buffer<wchar_t> *)((long)&local_10->_vptr_buffer + (long)__first * 4);
  } while (local_10 != in_RDX);
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  do {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  } while (begin != end);
}